

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O2

void __thiscall
spirv_cross::CFG::
walk_from<spirv_cross::Compiler::analyze_variable_scope(spirv_cross::SPIRFunction&,spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
          (CFG *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *seen_blocks,uint32_t block,anon_class_16_2_2fc8764d *op)

{
  uint *puVar1;
  size_t sVar2;
  undefined8 in_RAX;
  size_type sVar3;
  iterator iVar4;
  SmallVector<unsigned_int,_8UL> *pSVar5;
  long lVar6;
  uint32_t local_38;
  key_type_conflict local_34;
  
  _local_38 = CONCAT44((key_type_conflict)((ulong)in_RAX >> 0x20),block);
  sVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&seen_blocks->_M_h,&local_38);
  if (sVar3 == 0) {
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)seen_blocks,&local_38);
    _local_38 = CONCAT44(local_38,local_38);
    iVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&op->blocks->_M_h,&local_34);
    if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      *op->static_loop_init = false;
    }
    pSVar5 = get_succeeding_edges(this,local_38);
    puVar1 = (pSVar5->super_VectorView<unsigned_int>).ptr;
    sVar2 = (pSVar5->super_VectorView<unsigned_int>).buffer_size;
    for (lVar6 = 0; sVar2 << 2 != lVar6; lVar6 = lVar6 + 4) {
      walk_from<spirv_cross::Compiler::analyze_variable_scope(spirv_cross::SPIRFunction&,spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                (this,seen_blocks,*(uint32_t *)((long)puVar1 + lVar6),op);
    }
  }
  return;
}

Assistant:

void walk_from(std::unordered_set<uint32_t> &seen_blocks, uint32_t block, const Op &op) const
	{
		if (seen_blocks.count(block))
			return;
		seen_blocks.insert(block);

		if (op(block))
		{
			for (auto b : get_succeeding_edges(block))
				walk_from(seen_blocks, b, op);
		}
	}